

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O0

void blend_a64_mask_avx2(uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,
                        uint8_t *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,
                        int h)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint in_ESI;
  long lVar6;
  void *in_RDI;
  long in_R8;
  uint in_R9D;
  undefined1 auVar7 [16];
  __m128i alVar8;
  __m128i v;
  __m128i v_00;
  void *in_stack_00000008;
  uint in_stack_00000010;
  uint32_t in_stack_00000018;
  int in_stack_00000020;
  __m128i v_res_b_2;
  __m128i v_m1_b_2;
  __m128i v_m0_b_2;
  __m128i v_res_b_1;
  __m128i v_m1_b_1;
  __m128i v_m0_b_1;
  __m128i v_res_b;
  __m128i v_m1_b;
  __m128i v_m0_b;
  __m128i _r;
  __m128i v_maxval_b;
  undefined4 in_stack_fffffffffffffe34;
  int in_stack_fffffffffffffe48;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  __m128i *in_stack_fffffffffffffe78;
  __m128i *in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe88 [16];
  undefined1 in_stack_fffffffffffffe98 [16];
  __m128i *in_stack_fffffffffffffea8;
  uint8_t *in_stack_fffffffffffffeb0;
  uint8_t *in_stack_fffffffffffffeb8;
  undefined8 uStack_140;
  uint32_t in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined8 local_e8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_88;
  undefined8 uStack_80;
  
  auVar7 = vpinsrb_avx(ZEXT116(0x40),0x40,1);
  auVar7 = vpinsrb_avx(auVar7,0x40,2);
  auVar7 = vpinsrb_avx(auVar7,0x40,3);
  auVar7 = vpinsrb_avx(auVar7,0x40,4);
  auVar7 = vpinsrb_avx(auVar7,0x40,5);
  auVar7 = vpinsrb_avx(auVar7,0x40,6);
  auVar7 = vpinsrb_avx(auVar7,0x40,7);
  auVar7 = vpinsrb_avx(auVar7,0x40,8);
  auVar7 = vpinsrb_avx(auVar7,0x40,9);
  auVar7 = vpinsrb_avx(auVar7,0x40,10);
  auVar7 = vpinsrb_avx(auVar7,0x40,0xb);
  auVar7 = vpinsrb_avx(auVar7,0x40,0xc);
  auVar7 = vpinsrb_avx(auVar7,0x40,0xd);
  auVar7 = vpinsrb_avx(auVar7,0x40,0xe);
  auVar7 = vpinsrb_avx(auVar7,0x40,0xf);
  local_88 = auVar7._0_8_;
  uStack_80 = auVar7._8_8_;
  auVar1 = vpinsrw_avx(ZEXT216(0x200),0x200,1);
  auVar1 = vpinsrw_avx(auVar1,0x200,2);
  auVar1 = vpinsrw_avx(auVar1,0x200,3);
  auVar1 = vpinsrw_avx(auVar1,0x200,4);
  auVar1 = vpinsrw_avx(auVar1,0x200,5);
  auVar1 = vpinsrw_avx(auVar1,0x200,6);
  auVar1 = vpinsrw_avx(auVar1,0x200,7);
  local_b8 = auVar1._0_8_;
  uStack_b0 = auVar1._8_8_;
  local_e8 = in_R8;
  local_c8 = in_RDI;
  if (in_stack_00000018 == 4) {
    do {
      xx_loadl_32(in_stack_00000008);
      auVar1._8_8_ = uStack_80;
      auVar1._0_8_ = local_88;
      auVar7._8_8_ = uStack_b0;
      auVar7._0_8_ = local_b8;
      auVar7 = vpsubb_avx(auVar1,auVar7);
      lVar6 = local_e8;
      alVar8 = blend_4_u8(in_stack_fffffffffffffe98._0_8_,in_stack_fffffffffffffe88._8_8_,
                          in_stack_fffffffffffffe88._0_8_,in_stack_fffffffffffffe80,
                          in_stack_fffffffffffffe78);
      local_b8 = auVar7._0_8_;
      uStack_140 = auVar7._8_8_;
      alVar8[0] = lVar6;
      uStack_b0 = uStack_140;
      xx_storel_32(local_c8,alVar8);
      local_c8 = (void *)((long)local_c8 + (ulong)in_ESI);
      local_e8 = local_e8 + (ulong)in_R9D;
      in_stack_00000008 = (void *)((long)in_stack_00000008 + (ulong)in_stack_00000010);
      in_stack_00000020 = in_stack_00000020 + -1;
    } while (in_stack_00000020 != 0);
  }
  else if (in_stack_00000018 == 8) {
    do {
      xx_loadl_64(in_stack_00000008);
      auVar5._8_8_ = uStack_80;
      auVar5._0_8_ = local_88;
      auVar4._8_8_ = uStack_b0;
      auVar4._0_8_ = local_b8;
      auVar7 = vpsubb_avx(auVar5,auVar4);
      lVar6 = local_e8;
      alVar8 = blend_8_u8(auVar7._0_8_,in_stack_fffffffffffffe88._8_8_,
                          in_stack_fffffffffffffe88._0_8_,in_stack_fffffffffffffe80,
                          in_stack_fffffffffffffe78);
      v[1] = alVar8[1];
      local_b8 = auVar7._0_8_;
      uStack_b0 = auVar7._8_8_;
      v[0] = lVar6;
      xx_storel_64(local_c8,v);
      local_c8 = (void *)((long)local_c8 + (ulong)in_ESI);
      local_e8 = local_e8 + (ulong)in_R9D;
      in_stack_00000008 = (void *)((long)in_stack_00000008 + (ulong)in_stack_00000010);
      in_stack_00000020 = in_stack_00000020 + -1;
      in_stack_fffffffffffffe88 = auVar7;
    } while (in_stack_00000020 != 0);
  }
  else if (in_stack_00000018 == 0x10) {
    do {
      xx_loadu_128(in_stack_00000008);
      auVar3._8_8_ = uStack_80;
      auVar3._0_8_ = local_88;
      auVar2._8_8_ = uStack_b0;
      auVar2._0_8_ = local_b8;
      auVar7 = vpsubb_avx(auVar3,auVar2);
      lVar6 = local_e8;
      alVar8 = blend_16_u8(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                           in_stack_fffffffffffffea8,in_stack_fffffffffffffe98._8_8_,
                           in_stack_fffffffffffffe98._0_8_);
      v_00[1] = alVar8[1];
      local_1a8 = auVar7._0_8_;
      uStack_1a0 = auVar7._8_8_;
      v_00[0] = lVar6;
      local_b8 = local_1a8;
      uStack_b0 = uStack_1a0;
      xx_storeu_128(local_c8,v_00);
      local_c8 = (void *)((long)local_c8 + (ulong)in_ESI);
      local_e8 = local_e8 + (ulong)in_R9D;
      in_stack_00000008 = (void *)((long)in_stack_00000008 + (ulong)in_stack_00000010);
      in_stack_00000020 = in_stack_00000020 + -1;
    } while (in_stack_00000020 != 0);
  }
  else {
    blend_a64_mask_w32n_avx2
              ((uint8_t *)CONCAT44(in_R9D,in_stack_ffffffffffffff10),in_stack_ffffffffffffff0c,
               uStack_80,auVar7._4_4_,uStack_b0,auVar1._4_4_,
               (uint8_t *)CONCAT44(in_stack_fffffffffffffe34,in_stack_00000010),in_stack_00000018,
               in_stack_00000020,in_stack_fffffffffffffe48);
  }
  return;
}

Assistant:

static inline void blend_a64_mask_avx2(
    uint8_t *dst, uint32_t dst_stride, const uint8_t *src0,
    uint32_t src0_stride, const uint8_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  const __m128i v_maxval_b = _mm_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i _r = _mm_set1_epi16(1 << (15 - AOM_BLEND_A64_ROUND_BITS));
  switch (w) {
    case 4:
      do {
        const __m128i v_m0_b = xx_loadl_32(mask);
        const __m128i v_m1_b = _mm_sub_epi8(v_maxval_b, v_m0_b);
        const __m128i v_res_b = blend_4_u8(src0, src1, &v_m0_b, &v_m1_b, &_r);

        xx_storel_32(dst, v_res_b);

        dst += dst_stride;
        src0 += src0_stride;
        src1 += src1_stride;
        mask += mask_stride;
      } while (--h);
      break;
    case 8:
      do {
        const __m128i v_m0_b = xx_loadl_64(mask);
        const __m128i v_m1_b = _mm_sub_epi8(v_maxval_b, v_m0_b);
        const __m128i v_res_b = blend_8_u8(src0, src1, &v_m0_b, &v_m1_b, &_r);

        xx_storel_64(dst, v_res_b);

        dst += dst_stride;
        src0 += src0_stride;
        src1 += src1_stride;
        mask += mask_stride;
      } while (--h);
      break;
    case 16:
      do {
        const __m128i v_m0_b = xx_loadu_128(mask);
        const __m128i v_m1_b = _mm_sub_epi8(v_maxval_b, v_m0_b);
        const __m128i v_res_b = blend_16_u8(src0, src1, &v_m0_b, &v_m1_b, &_r);

        xx_storeu_128(dst, v_res_b);
        dst += dst_stride;
        src0 += src0_stride;
        src1 += src1_stride;
        mask += mask_stride;
      } while (--h);
      break;
    default:
      blend_a64_mask_w32n_avx2(dst, dst_stride, src0, src0_stride, src1,
                               src1_stride, mask, mask_stride, w, h);
  }
}